

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::ScrollArea::sizeHint(ScrollArea *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AbstractScrollAreaPrivate *pAVar4;
  long lVar5;
  int iVar6;
  int extraout_EAX;
  int iVar7;
  int iVar8;
  int extraout_var;
  QSize QVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QFontMetrics local_30 [8];
  
  pAVar4 = (this->super_AbstractScrollArea).d.d;
  QFontMetrics::QFontMetrics
            (local_30,(QFont *)(*(long *)&(this->super_AbstractScrollArea).field_0x20 + 0x38));
  iVar6 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics(local_30);
  if (((pAVar4[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
      (*(int *)((long)pAVar4[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) ||
     (pAVar4[1].q == (AbstractScrollArea *)0x0)) {
    iVar12 = iVar6 * 0xc;
    iVar10 = iVar6 * 8;
  }
  else if ((char)pAVar4[1].indicatorColor.cspec == Rgb) {
    (**(code **)(*(long *)pAVar4[1].q + 0x70))();
    iVar10 = extraout_var;
    iVar12 = extraout_EAX;
  }
  else {
    lVar5 = *(long *)&(pAVar4[1].q)->field_0x20;
    iVar12 = (*(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14)) + 1;
    iVar10 = (*(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18)) + 1;
  }
  iVar11 = pAVar4->left;
  iVar1 = pAVar4->right;
  iVar2 = pAVar4->top;
  iVar3 = pAVar4->bottom;
  iVar7 = QFrame::frameWidth();
  iVar8 = QFrame::frameWidth();
  iVar12 = iVar12 + iVar11 + iVar1 + iVar7 * 2;
  iVar11 = iVar10 + iVar2 + iVar3 + iVar8 * 2;
  iVar10 = iVar6 * 0x24;
  if (SBORROW4(iVar12,iVar6 * 0x24) != iVar12 + iVar6 * -0x24 < 0) {
    iVar10 = iVar12;
  }
  iVar12 = iVar6 * 0x18;
  if (SBORROW4(iVar11,iVar6 * 0x18) != iVar11 + iVar6 * -0x18 < 0) {
    iVar12 = iVar11;
  }
  QVar9.ht = iVar12;
  QVar9.wd = iVar10;
  return QVar9;
}

Assistant:

QSize
ScrollArea::sizeHint() const
{
	const ScrollAreaPrivate * d = d_func();

	QSize sz( 0, 0 );
	const int h = fontMetrics().height();

	if( d->widget )
		sz += ( d->resizable ? d->widget->sizeHint() : d->widget->size() );
	else
		sz += QSize( 12 * h, 8 * h );

	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	sz += marginsSize + frameSize;

	return sz.boundedTo( QSize( 36 * h, 24 * h ) );
}